

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

ConstPixelBufferAccess * __thiscall
sglr::ReferenceContext::getUnpack3DAccess
          (ConstPixelBufferAccess *__return_storage_ptr__,ReferenceContext *this,
          TextureFormat *format,int width,int height,int depth,void *data)

{
  int iVar1;
  int iVar2;
  uint rowPitch;
  int iVar3;
  
  iVar1 = tcu::TextureFormat::getPixelSize(format);
  iVar2 = this->m_pixelUnpackRowLength;
  if (this->m_pixelUnpackRowLength < 1) {
    iVar2 = width;
  }
  iVar3 = this->m_pixelUnpackImageHeight;
  if (this->m_pixelUnpackImageHeight < 1) {
    iVar3 = height;
  }
  rowPitch = -this->m_pixelUnpackAlignment & (iVar2 * iVar1 + this->m_pixelUnpackAlignment) - 1U;
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (__return_storage_ptr__,format,width,height,depth,rowPitch,iVar3 * rowPitch,
             (void *)((long)data +
                     (long)(iVar1 * this->m_pixelUnpackSkipPixels) +
                     (long)(int)(this->m_pixelUnpackSkipRows * rowPitch) +
                     (long)(int)(this->m_pixelUnpackSkipImages * iVar3 * rowPitch)));
  return __return_storage_ptr__;
}

Assistant:

tcu::ConstPixelBufferAccess ReferenceContext::getUnpack3DAccess (const tcu::TextureFormat& format, int width, int height, int depth, const void* data)
{
	int				pixelSize	= format.getPixelSize();
	int				rowLen		= m_pixelUnpackRowLength	> 0 ? m_pixelUnpackRowLength	: width;
	int				imageHeight	= m_pixelUnpackImageHeight	> 0 ? m_pixelUnpackImageHeight	: height;
	int				rowPitch	= deAlign32(rowLen*pixelSize, m_pixelUnpackAlignment);
	int				slicePitch	= imageHeight*rowPitch;
	const deUint8*	ptr			= (const deUint8*)data + m_pixelUnpackSkipImages*slicePitch + m_pixelUnpackSkipRows*rowPitch + m_pixelUnpackSkipPixels*pixelSize;

	return tcu::ConstPixelBufferAccess(format, width, height, depth, rowPitch, slicePitch, ptr);
}